

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O0

void __thiscall TiXmlDeclaration::~TiXmlDeclaration(TiXmlDeclaration *this)

{
  TiXmlDeclaration *this_local;
  
  ~TiXmlDeclaration(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~TiXmlDeclaration()	{}